

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

QHttp2Connection *
QHttp2Connection::createUpgradedConnection(QIODevice *socket,QHttp2Configuration *config)

{
  QHttp2Connection *this;
  QHttp2Stream *this_00;
  QHttp2Connection *this_01;
  long in_FS_OFFSET;
  QHttp2Configuration QStack_38;
  _Variadic_union<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> local_30 [2];
  long local_20;
  
  this_01 = (QHttp2Connection *)&QStack_38;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QHttp2Connection *)operator_new(0x2b8);
  QHttp2Connection((QHttp2Connection *)this,socket);
  QHttp2Configuration::QHttp2Configuration(&QStack_38,config);
  setH2Configuration((QHttp2Connection *)this,(QHttp2Configuration)&QStack_38);
  QHttp2Configuration::~QHttp2Configuration(&QStack_38);
  this->m_connectionType = Client;
  this->m_upgradedConnection = true;
  local_30[0] = (_Variadic_union<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>)
                createLocalStreamInternal
                          ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)this,
                           this_01);
  this_00 = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::unwrap
                      ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                       &local_30[0]._M_first);
  QHttp2Stream::setState((QHttp2Stream *)this_00,HalfClosedLocal);
  if (this->m_prefaceSent == false) {
    (**(code **)(*(long *)this + 0x20))(this);
    this = (QHttp2Connection *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Connection *QHttp2Connection::createUpgradedConnection(QIODevice *socket,
                                                             const QHttp2Configuration &config)
{
    Q_ASSERT(socket);

    auto connection = std::unique_ptr<QHttp2Connection>(new QHttp2Connection(socket));
    connection->setH2Configuration(config);
    connection->m_connectionType = QHttp2Connection::Type::Client;
    connection->m_upgradedConnection = true;
    // HTTP2 connection is already established and request was sent, so stream 1
    // is already 'active' and is closed for any further outgoing data.
    QHttp2Stream *stream = connection->createLocalStreamInternal().unwrap();
    Q_ASSERT(stream->streamID() == 1);
    stream->setState(QHttp2Stream::State::HalfClosedLocal);

    if (!connection->m_prefaceSent) // Preface is sent as part of initial stream-creation.
        return nullptr;

    return connection.release();
}